

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::schema::Node::SourceInfo::Reader>::dispose
          (Array<capnp::schema::Node::SourceInfo::Reader> *this)

{
  Reader *firstElement;
  size_t elementCount;
  size_t sizeCopy;
  Reader *ptrCopy;
  Array<capnp::schema::Node::SourceInfo::Reader> *this_local;
  
  firstElement = this->ptr;
  elementCount = this->size_;
  if (firstElement != (Reader *)0x0) {
    this->ptr = (Reader *)0x0;
    this->size_ = 0;
    ArrayDisposer::dispose<capnp::schema::Node::SourceInfo::Reader>
              (this->disposer,firstElement,elementCount,elementCount);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }